

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_device_uninit(ma_device *pDevice)

{
  void *pvVar1;
  _func_void_void_ptr_void_ptr *p_Var2;
  ma_context *pmVar3;
  
  if ((pDevice != (ma_device *)0x0) && (pDevice->state != 0)) {
    if (pDevice->state == 2) {
      ma_device_stop(pDevice);
    }
    LOCK();
    pDevice->state = 0;
    UNLOCK();
    pmVar3 = pDevice->pContext;
    if ((pmVar3->field_0xb8 & 1) == 0) {
      ma_event_signal(&pDevice->wakeupEvent);
      (*(((pDevice->thread).pContext)->field_22).posix.pthread_join)((pDevice->thread).field_1);
      pmVar3 = pDevice->pContext;
    }
    (*pmVar3->onDeviceUninit)(pDevice);
    ma_event_uninit(&pDevice->stopEvent);
    ma_event_uninit(&pDevice->startEvent);
    ma_event_uninit(&pDevice->wakeupEvent);
    pmVar3 = (pDevice->lock).pContext;
    if (pmVar3 != (ma_context *)0x0) {
      (*(pmVar3->field_22).posix.pthread_mutex_destroy)(&(pDevice->lock).field_1);
    }
    if ((pDevice->field_0x1ac & 8) != 0) {
      pmVar3 = pDevice->pContext;
      pvVar1 = (pmVar3->allocationCallbacks).pUserData;
      p_Var2 = (pmVar3->allocationCallbacks).onFree;
      ma_context_uninit(pmVar3);
      if (p_Var2 != (_func_void_void_ptr_void_ptr *)0x0 && pDevice->pContext != (ma_context *)0x0) {
        (*p_Var2)(pDevice->pContext,pvVar1);
      }
    }
    memset(pDevice,0,0x55d0);
    return;
  }
  return;
}

Assistant:

static ma_bool32 ma_device__is_initialized(ma_device* pDevice)
{
    if (pDevice == NULL) {
        return MA_FALSE;
    }

    return ma_device__get_state(pDevice) != MA_STATE_UNINITIALIZED;
}